

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::TypedExpectation<void_(const_absl::lts_20250127::LogEntry_&)>::
ExplainMatchResultTo
          (TypedExpectation<void_(const_absl::lts_20250127::LogEntry_&)> *this,ArgumentTuple *args,
          ostream *os)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  pointer this_00;
  __shared_ptr_access<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_01;
  element_type *this_02;
  _Self local_230;
  _Self local_228;
  const_iterator it;
  undefined1 local_218 [4];
  int i;
  ExpectationSet unsatisfied_prereqs;
  undefined1 local_1b8 [8];
  StringMatchResultListener listener;
  ostream *os_local;
  ArgumentTuple *args_local;
  TypedExpectation<void_(const_absl::lts_20250127::LogEntry_&)> *this_local;
  
  listener._400_8_ = os;
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar2 = ExpectationBase::is_retired(&this->super_ExpectationBase);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)listener._400_8_,
                             "         Expected: the expectation is active\n");
    std::operator<<(poVar3,"           Actual: it is retired\n");
  }
  else {
    bVar2 = Matches(this,args);
    if (bVar2) {
      bVar2 = ExpectationBase::AllPrerequisitesAreSatisfied(&this->super_ExpectationBase);
      if (bVar2) {
        std::operator<<((ostream *)listener._400_8_,"The call matches the expectation.\n");
      }
      else {
        poVar3 = std::operator<<((ostream *)listener._400_8_,
                                 "         Expected: all pre-requisites are satisfied\n");
        poVar3 = std::operator<<(poVar3,"           Actual: the following immediate pre-requisites "
                                );
        std::operator<<(poVar3,"are not satisfied:\n");
        ExpectationSet::ExpectationSet((ExpectationSet *)local_218);
        ExpectationBase::FindUnsatisfiedPrerequisites
                  (&this->super_ExpectationBase,(ExpectationSet *)local_218);
        it._M_node._4_4_ = 0;
        local_228._M_node = (_Base_ptr)ExpectationSet::begin((ExpectationSet *)local_218);
        while( true ) {
          local_230._M_node = (_Base_ptr)ExpectationSet::end((ExpectationSet *)local_218);
          bVar2 = std::operator!=(&local_228,&local_230);
          if (!bVar2) break;
          this_00 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->(&local_228);
          this_01 = (__shared_ptr_access<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)Expectation::expectation_base(this_00);
          this_02 = std::
                    __shared_ptr_access<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(this_01);
          ExpectationBase::DescribeLocationTo(this_02,(ostream *)listener._400_8_);
          poVar3 = std::operator<<((ostream *)listener._400_8_,"pre-requisite #");
          iVar1 = it._M_node._4_4_;
          it._M_node._4_4_ = it._M_node._4_4_ + 1;
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
          std::operator<<(poVar3,"\n");
          std::_Rb_tree_const_iterator<testing::Expectation>::operator++(&local_228);
        }
        std::operator<<((ostream *)listener._400_8_,"                   (end of pre-requisites)\n");
        ExpectationSet::~ExpectationSet((ExpectationSet *)local_218);
      }
    }
    else {
      bVar2 = TupleMatches<std::tuple<testing::Matcher<absl::lts_20250127::LogEntry_const&>>,std::tuple<absl::lts_20250127::LogEntry_const&>>
                        (&this->matchers_,args);
      if (!bVar2) {
        ExplainMatchFailureTupleTo<std::tuple<testing::Matcher<absl::lts_20250127::LogEntry_const&>>,std::tuple<absl::lts_20250127::LogEntry_const&>>
                  (&this->matchers_,args,(ostream *)listener._400_8_);
      }
      StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1b8);
      bVar2 = MatcherBase<const_std::tuple<const_absl::lts_20250127::LogEntry_&>_&>::MatchAndExplain
                        (&(this->extra_matcher_).
                          super_MatcherBase<const_std::tuple<const_absl::lts_20250127::LogEntry_&>_&>
                         ,args,(MatchResultListener *)local_1b8);
      if (!bVar2) {
        std::operator<<((ostream *)listener._400_8_,"    Expected args: ");
        MatcherBase<const_std::tuple<const_absl::lts_20250127::LogEntry_&>_&>::DescribeTo
                  (&(this->extra_matcher_).
                    super_MatcherBase<const_std::tuple<const_absl::lts_20250127::LogEntry_&>_&>,
                   (ostream *)listener._400_8_);
        std::operator<<((ostream *)listener._400_8_,"\n           Actual: don\'t match");
        StringMatchResultListener::str_abi_cxx11_
                  ((string *)
                   &unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,(StringMatchResultListener *)local_1b8);
        PrintIfNotEmpty((string *)
                        &unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count,(ostream *)listener._400_8_);
        std::__cxx11::string::~string
                  ((string *)
                   &unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count);
        std::operator<<((ostream *)listener._400_8_,"\n");
      }
      StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1b8);
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    if (is_retired()) {
      *os << "         Expected: the expectation is active\n"
          << "           Actual: it is retired\n";
    } else if (!Matches(args)) {
      if (!TupleMatches(matchers_, args)) {
        ExplainMatchFailureTupleTo(matchers_, args, os);
      }
      StringMatchResultListener listener;
      if (!extra_matcher_.MatchAndExplain(args, &listener)) {
        *os << "    Expected args: ";
        extra_matcher_.DescribeTo(os);
        *os << "\n           Actual: don't match";

        internal::PrintIfNotEmpty(listener.str(), os);
        *os << "\n";
      }
    } else if (!AllPrerequisitesAreSatisfied()) {
      *os << "         Expected: all pre-requisites are satisfied\n"
          << "           Actual: the following immediate pre-requisites "
          << "are not satisfied:\n";
      ExpectationSet unsatisfied_prereqs;
      FindUnsatisfiedPrerequisites(&unsatisfied_prereqs);
      int i = 0;
      for (ExpectationSet::const_iterator it = unsatisfied_prereqs.begin();
           it != unsatisfied_prereqs.end(); ++it) {
        it->expectation_base()->DescribeLocationTo(os);
        *os << "pre-requisite #" << i++ << "\n";
      }
      *os << "                   (end of pre-requisites)\n";
    } else {
      // This line is here just for completeness' sake.  It will never
      // be executed as currently the ExplainMatchResultTo() function
      // is called only when the mock function call does NOT match the
      // expectation.
      *os << "The call matches the expectation.\n";
    }
  }